

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::TreeEnsembleParameters_TreeNode
          (TreeEnsembleParameters_TreeNode *this,TreeEnsembleParameters_TreeNode *from)

{
  void *pvVar1;
  uint64 uVar2;
  uint64 uVar3;
  uint64 uVar4;
  double dVar5;
  uint64 uVar6;
  double dVar7;
  int iVar8;
  bool bVar9;
  undefined3 uVar10;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__TreeEnsembleParameters_TreeNode_0076f7b0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  google::protobuf::
  RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>::
  RepeatedPtrField(&this->evaluationinfo_,&from->evaluationinfo_);
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  uVar2 = from->treeid_;
  uVar3 = from->nodeid_;
  iVar8 = from->nodebehavior_;
  bVar9 = from->missingvaluetrackstruechild_;
  uVar10 = *(undefined3 *)&from->field_0x3d;
  uVar4 = from->branchfeatureindex_;
  dVar5 = from->branchfeaturevalue_;
  uVar6 = from->truechildnodeid_;
  dVar7 = from->relativehitrate_;
  this->falsechildnodeid_ = from->falsechildnodeid_;
  this->relativehitrate_ = dVar7;
  this->branchfeaturevalue_ = dVar5;
  this->truechildnodeid_ = uVar6;
  this->nodebehavior_ = iVar8;
  this->missingvaluetrackstruechild_ = bVar9;
  *(undefined3 *)&this->field_0x3d = uVar10;
  this->branchfeatureindex_ = uVar4;
  this->treeid_ = uVar2;
  this->nodeid_ = uVar3;
  return;
}

Assistant:

TreeEnsembleParameters_TreeNode::TreeEnsembleParameters_TreeNode(const TreeEnsembleParameters_TreeNode& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      evaluationinfo_(from.evaluationinfo_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&treeid_, &from.treeid_,
    reinterpret_cast<char*>(&relativehitrate_) -
    reinterpret_cast<char*>(&treeid_) + sizeof(relativehitrate_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.TreeEnsembleParameters.TreeNode)
}